

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void dump_token(SToken *t)

{
  ostream *poVar1;
  char *pcVar2;
  
  switch(t->type) {
  case LEFT_BRACE:
    pcVar2 = "LEFT_BRACE: ";
    break;
  case RIGHT_BRACE:
    pcVar2 = "RIGHT_BRACE: ";
    break;
  case BOOLEAN:
    pcVar2 = "BOOLEAN: ";
    break;
  case NUMBER:
    pcVar2 = "NUMBER: ";
    break;
  case STRING:
    pcVar2 = "STRING: ";
    break;
  case SEPARATOR:
    pcVar2 = "SEPARATOR: ";
    break;
  case EQUAL:
    pcVar2 = "EQUAL: ";
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"Unexpected value of token type");
    goto LAB_001023ec;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,pcVar2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
LAB_001023ec:
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void dump_token(const SToken& t)
{
    switch (t.type)
    {
        case LEFT_BRACE:
            std::cerr << "LEFT_BRACE: " << t.start << ", " << t.length << std::endl;
            break;
            
        case RIGHT_BRACE:
            std::cerr << "RIGHT_BRACE: " << t.start << ", " << t.length << std::endl;
            break;
            
        case BOOLEAN:
            std::cerr << "BOOLEAN: " << t.start << ", " << t.length << std::endl;
            break;
            
        case NUMBER:
            std::cerr << "NUMBER: " << t.start << ", " << t.length << std::endl;
            break;
            
        case STRING:
            std::cerr << "STRING: " << t.start << ", " << t.length << std::endl;
            break;
            
        case SEPARATOR:
            std::cerr << "SEPARATOR: " << t.start << ", " << t.length << std::endl;
            break;
            
        case EQUAL:
            std::cerr << "EQUAL: " << t.start << ", " << t.length << std::endl;
            break;
            
        default:
            std::cerr << "Unexpected value of token type" << std::endl;
    }
}